

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

void __thiscall ON_Material::ToPhysicallyBased(ON_Material *this)

{
  bool bVar1;
  ulong uVar2;
  undefined8 uVar3;
  double dVar4;
  shared_ptr<ON_PhysicallyBasedMaterial> pbr;
  undefined1 local_38 [32];
  
  bVar1 = IsPhysicallyBased(this);
  if (!bVar1) {
    std::make_shared<ON_PhysicallyBasedMaterial,ON_Material&>((ON_Material *)local_38);
    ON_REMOVE_ASAP_AssertEx
              ((uint)((_func_int **)local_38._0_8_ != (_func_int **)0x0),
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_material.cpp"
               ,0x2407,"","pbr != nullptr is false");
    uVar3 = local_38._0_8_;
    dVar4 = this->m_transparency;
    if ((0.01 <= dVar4) || (this->m_bFresnelReflections == true)) {
      bVar1 = false;
      uVar2 = (ulong)(0.99 < dVar4) << 4 | 0xa4;
    }
    else {
      bVar1 = 0.99 < this->m_reflectivity;
      uVar2 = 0xb0;
      if (this->m_reflectivity <= 0.99) {
        uVar2 = (ulong)(0.99 < dVar4) << 4 | 0xa4;
      }
    }
    ON_4fColor::ON_4fColor
              ((ON_4fColor *)(local_38 + 0x10),
               (ON_Color *)
               ((long)(&((ON_ModelComponent *)
                        (&((ON_ModelComponent *)
                          (&(this->super_ON_ModelComponent).m_component_id + -4))->m_component_id +
                        -4))->m_component_id + 0xfffffffffffffffc) + uVar2));
    (**(code **)(*(_func_int **)uVar3 + 0x30))(uVar3,local_38 + 0x10);
    if (bVar1) {
      uVar3 = 0x3ff0000000000000;
    }
    else {
      uVar3 = 0;
    }
    (**(code **)(*(_func_int **)local_38._0_8_ + 0x70))(uVar3);
    if (bVar1) {
      dVar4 = this->m_reflection_glossiness;
    }
    else {
      dVar4 = 1.0 - this->m_reflectivity;
    }
    (**(code **)(*(_func_int **)local_38._0_8_ + 0xb0))(dVar4);
    (**(code **)(*(_func_int **)local_38._0_8_ + 0x130))(1.0 - this->m_transparency);
    (**(code **)(*(_func_int **)local_38._0_8_ + 0x120))(this->m_index_of_refraction);
    bVar1 = IsPhysicallyBased(this);
    ON_REMOVE_ASAP_AssertEx
              ((uint)bVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_material.cpp"
               ,0x2412,"","IsPhysicallyBased() is false");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  }
  return;
}

Assistant:

void ON_Material::ToPhysicallyBased(void)
{
  if (IsPhysicallyBased())
    return;

  //This should always be valid.
  auto pbr = std::make_shared<ON_PhysicallyBasedMaterial>(*this);
  ON_ASSERT(pbr != nullptr);

  const bool bMetal = m_transparency < 0.01 && !m_bFresnelReflections && m_reflectivity > 0.99;
  const bool bGlass = m_transparency > 0.99;

  pbr->SetBaseColor(bMetal ? m_reflection : bGlass ? m_transparent : m_diffuse);
  pbr->SetMetallic(bMetal ? 1.0 : 0.0);
  pbr->SetRoughness(bMetal ? m_reflection_glossiness : 1.0 - m_reflectivity);
  pbr->SetOpacity(1.0 - m_transparency);
  pbr->SetOpacityIOR(m_index_of_refraction);

  ON_ASSERT(IsPhysicallyBased());
}